

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  char cVar6;
  byte bVar7;
  uint32_t i;
  uint uVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  undefined1 *puVar14;
  int iVar15;
  uint uVar16;
  undefined1 *puVar17;
  uint uVar18;
  undefined8 *puVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  uint32_t auVar27 [2];
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t alpha_selectors [16];
  uint8_t color_selectors [16];
  uint32_t pbits [3] [2];
  undefined8 local_b8;
  uint local_b0;
  bc7_optimization_results *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  uint local_84;
  ulong local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t local_58 [4] [2];
  ulong local_38;
  
  uVar13 = pResults->m_mode;
  uVar21 = (ulong)uVar13;
  lVar9 = (long)(int)uVar13;
  bVar2 = *(byte *)((long)&g_bc7_num_subsets + uVar21);
  local_38 = uVar21 - 4;
  if (uVar21 - 4 < 3) {
    puVar14 = &g_bc7_partition1;
  }
  else {
    uVar22 = pResults->m_partition << 4;
    if ((0x8aUL >> (uVar21 & 0x3f) & 1) == 0) {
      puVar14 = g_bc7_partition3 + uVar22;
    }
    else {
      puVar14 = g_bc7_partition2 + uVar22;
    }
  }
  local_68 = *(undefined8 *)pResults->m_selectors;
  uStack_60 = *(undefined8 *)(pResults->m_selectors + 8);
  local_78 = *(undefined8 *)pResults->m_alpha_selectors;
  uStack_70 = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  puVar19 = &local_90;
  local_90 = *(undefined8 *)pResults->m_low;
  local_88 = *(undefined4 *)pResults->m_low[2].m_c;
  puVar25 = &local_a0;
  local_a0 = *(undefined8 *)pResults->m_high;
  local_98 = *(undefined4 *)pResults->m_high[2].m_c;
  local_58[2] = pResults->m_pbits[2];
  local_58[0] = pResults->m_pbits[0];
  local_58[1] = pResults->m_pbits[1];
  local_b0 = 0xffffffff;
  local_b8 = 0xffffffffffffffff;
  cVar6 = (char)pResults->m_index_selector;
  uVar22 = 1 << (*(char *)((long)&g_bc7_color_index_bitcount + lVar9) + cVar6 & 0x1fU);
  local_80 = (ulong)bVar2;
  uVar23 = 0;
  local_a8 = pResults;
  do {
    if (uVar23 == 0) {
      bVar7 = 0;
    }
    else {
      puVar10 = g_bc7_table_anchor_index_second_subset;
      if (uVar23 == 2) {
        puVar10 = g_bc7_table_anchor_index_third_subset_2;
      }
      if ((uVar13 & 0xfffffffd) != 0) {
        puVar10 = g_bc7_table_anchor_index_second_subset;
      }
      puVar17 = puVar10;
      if (uVar23 == 1) {
        puVar17 = g_bc7_table_anchor_index_third_subset_1;
      }
      if ((uVar13 & 0xfffffffd) == 0) {
        puVar10 = puVar17;
      }
      bVar7 = puVar10[local_a8->m_partition];
    }
    *(uint *)((long)&local_b8 + uVar23 * 4) = (uint)bVar7;
    if ((uVar22 >> 1 & (uint)*(byte *)((long)&local_68 + (ulong)bVar7)) != 0) {
      lVar11 = 0;
      do {
        if (uVar23 == (byte)puVar14[lVar11]) {
          *(byte *)((long)&local_68 + lVar11) = ~*(byte *)((long)&local_68 + lVar11) + (char)uVar22;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      if ((uVar13 & 0xfffffffe) == 4) {
        lVar11 = 0;
        do {
          uVar3 = *(undefined1 *)((long)puVar19 + lVar11);
          *(undefined1 *)((long)puVar19 + lVar11) = *(undefined1 *)((long)puVar25 + lVar11);
          *(undefined1 *)((long)puVar25 + lVar11) = uVar3;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      else {
        uVar4 = *(undefined4 *)((long)&local_90 + uVar23 * 4);
        *(undefined4 *)((long)&local_90 + uVar23 * 4) =
             *(undefined4 *)((long)&local_a0 + uVar23 * 4);
        *(undefined4 *)((long)&local_a0 + uVar23 * 4) = uVar4;
      }
      if (uVar13 != 1) {
        auVar27[1] = SUB84(local_58[uVar23],0);
        auVar27[0] = SUB84(local_58[uVar23],4);
        local_58[uVar23] = auVar27;
      }
    }
    if (((uVar13 & 0xfffffffe) == 4) &&
       (uVar16 = 1 << (*(char *)((long)&g_bc7_alpha_index_bitcount + lVar9) - cVar6 & 0x1fU),
       (uVar16 >> 1 & (uint)*(byte *)((long)&local_78 + (ulong)bVar7)) != 0)) {
      lVar11 = 0;
      do {
        if (uVar23 == (byte)puVar14[lVar11]) {
          *(byte *)((long)&local_78 + lVar11) = ~*(byte *)((long)&local_78 + lVar11) + (char)uVar16;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      uVar3 = *(undefined1 *)((long)&local_90 + uVar23 * 4 + 3);
      *(undefined1 *)((long)&local_90 + uVar23 * 4 + 3) =
           *(undefined1 *)((long)&local_a0 + uVar23 * 4 + 3);
      *(undefined1 *)((long)&local_a0 + uVar23 * 4 + 3) = uVar3;
    }
    uVar23 = uVar23 + 1;
    puVar19 = (undefined8 *)((long)puVar19 + 4);
    puVar25 = (undefined8 *)((long)puVar25 + 4);
  } while (uVar23 != (uint)bVar2 + (uint)(bVar2 == 0));
  uVar23 = 1L << ((byte)uVar13 & 0x3f);
  *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
  uVar22 = uVar13 + 1;
  if ((uVar22 < 0x21) && (uVar23 >> ((byte)uVar22 & 0x3f) == 0)) {
    if (uVar22 == 0) {
      uVar26 = 0;
    }
    else {
      uVar16 = 0;
      do {
        uVar18 = 8 - (uVar16 & 7);
        if (uVar22 <= uVar18) {
          uVar18 = uVar22;
        }
        uVar26 = (ulong)(uVar18 + uVar16);
        pbVar1 = (byte *)((long)pBlock + (ulong)(uVar16 >> 3));
        *pbVar1 = *pbVar1 | (byte)((uint)uVar23 << (sbyte)(uVar16 & 7));
        uVar23 = (ulong)((uint)uVar23 >> ((byte)uVar18 & 0x1f));
        uVar22 = uVar22 - uVar18;
        uVar16 = uVar18 + uVar16;
      } while (uVar22 != 0);
    }
    if (0x80 < (uint)uVar26) {
LAB_00132fed:
      __assert_fail("*pCur_ofs <= 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2cfa,
                    "void basist::bc7_set_block_bits(uint8_t *, uint32_t, uint32_t, uint32_t *)");
    }
    uVar22 = uVar13 & 0xfffffffe;
    if (uVar22 == 4) {
      uVar16 = local_a8->m_rotation;
      if (3 < uVar16) goto LAB_00132fce;
      uVar18 = 2;
      do {
        uVar8 = (uint)uVar26;
        uVar12 = 8 - (uVar8 & 7);
        if (uVar18 <= uVar12) {
          uVar12 = uVar18;
        }
        uVar26 = (ulong)(uVar12 + uVar8);
        pbVar1 = (byte *)((long)pBlock + (ulong)(uVar8 >> 3));
        *pbVar1 = *pbVar1 | (byte)(uVar16 << (sbyte)(uVar8 & 7));
        uVar16 = uVar16 >> ((byte)uVar12 & 0x1f);
        uVar18 = uVar18 - uVar12;
      } while (uVar18 != 0);
      if (0x80 < uVar12 + uVar8) goto LAB_00132fed;
    }
    if (uVar13 == 4) {
      if (1 < local_a8->m_index_selector) goto LAB_00132fce;
      pbVar1 = (byte *)((long)pBlock + (uVar26 >> 3));
      *pbVar1 = *pbVar1 | (byte)(local_a8->m_index_selector << ((byte)uVar26 & 7));
      if (0x7f < (uint)uVar26) goto LAB_00132fed;
      uVar26 = (ulong)((uint)uVar26 + 1);
    }
    local_84 = uVar22;
    if (2 < local_38) {
      uVar16 = local_a8->m_partition;
      uVar18 = (uint)((0x8eUL >> (uVar21 & 0x3f) & 1) != 0) * 2 + 4;
      uVar23 = uVar26;
      if (uVar16 >> (sbyte)uVar18 != 0) goto LAB_00132fce;
      do {
        uVar8 = (uint)uVar23 & 7;
        uVar12 = 8 - uVar8;
        if (uVar18 <= uVar12) {
          uVar12 = uVar18;
        }
        uVar24 = uVar12 + (uint)uVar23;
        uVar26 = (ulong)uVar24;
        pbVar1 = (byte *)((long)pBlock + (uVar23 >> 3));
        *pbVar1 = *pbVar1 | (byte)(uVar16 << (sbyte)uVar8);
        uVar16 = uVar16 >> ((byte)uVar12 & 0x1f);
        uVar18 = uVar18 - uVar12;
        uVar23 = uVar26;
      } while (uVar18 != 0);
      if (0x80 < uVar24) goto LAB_00132fed;
    }
    iVar15 = (int)local_80;
    lVar11 = 0;
    do {
      uVar23 = 0;
      do {
        if (lVar11 == 3) {
          uVar16 = (uint)*(char *)((long)&g_bc7_alpha_precision_table + uVar21);
        }
        else {
          uVar16 = (uint)*(byte *)((long)&g_bc7_color_precision_table + uVar21);
        }
        bVar2 = *(byte *)((long)&local_90 + uVar23 * 4 + lVar11);
        uVar18 = (uint)bVar2;
        if ((0x20 < uVar16) || (bVar2 >> ((byte)uVar16 & 0x3f) != 0)) goto LAB_00132fce;
        for (; uVar12 = (uint)uVar26, uVar16 != 0; uVar16 = uVar16 - uVar8) {
          uVar8 = 8 - (uVar12 & 7);
          if (uVar16 <= uVar8) {
            uVar8 = uVar16;
          }
          pbVar1 = (byte *)((long)pBlock + (uVar26 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar18 << (sbyte)(uVar12 & 7));
          uVar18 = uVar18 >> ((byte)uVar8 & 0x1f);
          uVar26 = (ulong)(uVar8 + uVar12);
        }
        if (0x80 < uVar12) goto LAB_00132fed;
        if (lVar11 == 3) {
          uVar16 = (uint)*(char *)((long)&g_bc7_alpha_precision_table + uVar21);
        }
        else {
          uVar16 = (uint)*(byte *)((long)&g_bc7_color_precision_table + uVar21);
        }
        bVar2 = *(byte *)((long)&local_a0 + uVar23 * 4 + lVar11);
        uVar18 = (uint)bVar2;
        if ((0x20 < uVar16) || (bVar2 >> ((byte)uVar16 & 0x3f) != 0)) goto LAB_00132fce;
        for (; uVar12 = (uint)uVar26, uVar16 != 0; uVar16 = uVar16 - uVar8) {
          uVar8 = 8 - (uVar12 & 7);
          if (uVar16 <= uVar8) {
            uVar8 = uVar16;
          }
          pbVar1 = (byte *)((long)pBlock + (uVar26 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar18 << (sbyte)(uVar12 & 7));
          uVar18 = uVar18 >> ((byte)uVar8 & 0x1f);
          uVar26 = (ulong)(uVar8 + uVar12);
        }
        if (0x80 < uVar12) goto LAB_00132fed;
        uVar23 = uVar23 + 1;
      } while (uVar23 != iVar15 + (uint)(iVar15 == 0));
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4 - (ulong)(uVar13 < 4));
    if ((0x34UL >> (uVar21 & 0x3f) & 1) == 0) {
      uVar23 = 0;
      do {
        if (1 < local_58[uVar23][0]) goto LAB_00132fce;
        pbVar1 = (byte *)((long)pBlock + (uVar26 >> 3));
        *pbVar1 = *pbVar1 | (byte)(local_58[uVar23][0] << ((byte)uVar26 & 7));
        uVar12 = (int)uVar26 + 1;
        if (0x80 < uVar12) goto LAB_00132fed;
        if (uVar13 != 1) {
          if (1 < local_58[uVar23][1]) goto LAB_00132fce;
          pbVar1 = (byte *)((long)pBlock + (ulong)(uVar12 >> 3));
          *pbVar1 = *pbVar1 | (byte)(local_58[uVar23][1] << ((byte)uVar12 & 7));
          uVar12 = (int)uVar26 + 2;
          if (0x80 < uVar12) goto LAB_00132fed;
        }
        uVar23 = uVar23 + 1;
        uVar26 = (ulong)uVar12;
      } while (iVar15 + (uint)(iVar15 == 0) != uVar23);
    }
    lVar11 = 0;
    do {
      lVar20 = 0;
      do {
        uVar5 = local_a8->m_index_selector;
        if (uVar5 == 0) {
          uVar13 = (uint)*(byte *)((long)&g_bc7_color_index_bitcount + lVar9);
        }
        else {
          uVar13 = *(byte *)((long)&g_bc7_alpha_index_bitcount + lVar9) - uVar5;
        }
        uVar23 = lVar20 + lVar11 * 4;
        uVar13 = uVar13 - (uVar23 == local_b0 ||
                          (uVar23 == local_b8._4_4_ || uVar23 == (local_b8 & 0xffffffff)));
        puVar19 = &local_78;
        if (uVar5 == 0) {
          puVar19 = &local_68;
        }
        uVar16 = (uint)*(byte *)((long)puVar19 + uVar23);
        if ((0x20 < uVar13) || (*(byte *)((long)puVar19 + uVar23) >> ((byte)uVar13 & 0x3f) != 0))
        goto LAB_00132fce;
        for (; uVar13 != 0; uVar13 = uVar13 - uVar18) {
          uVar18 = 8 - (uVar12 & 7);
          if (uVar13 <= uVar18) {
            uVar18 = uVar13;
          }
          pbVar1 = (byte *)((long)pBlock + (ulong)(uVar12 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar16 << (sbyte)(uVar12 & 7));
          uVar16 = uVar16 >> ((byte)uVar18 & 0x1f);
          uVar12 = uVar18 + uVar12;
        }
        if (0x80 < uVar12) goto LAB_00132fed;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    if (uVar22 == 4) {
      lVar11 = 0;
      do {
        lVar20 = 0;
        do {
          uVar5 = local_a8->m_index_selector;
          if (uVar5 == 0) {
            uVar13 = (uint)*(byte *)((long)&g_bc7_alpha_index_bitcount + uVar21);
          }
          else {
            uVar13 = *(byte *)((long)&g_bc7_color_index_bitcount + lVar9) + uVar5;
          }
          uVar23 = lVar20 + lVar11 * 4;
          uVar13 = uVar13 - (uVar23 == local_b0 ||
                            (uVar23 == local_b8._4_4_ || uVar23 == (local_b8 & 0xffffffff)));
          puVar19 = &local_68;
          if (uVar5 == 0) {
            puVar19 = &local_78;
          }
          uVar22 = (uint)*(byte *)((long)puVar19 + uVar23);
          if ((0x20 < uVar13) || (*(byte *)((long)puVar19 + uVar23) >> ((byte)uVar13 & 0x3f) != 0))
          goto LAB_00132fce;
          for (; uVar13 != 0; uVar13 = uVar13 - uVar16) {
            uVar16 = 8 - (uVar12 & 7);
            if (uVar13 <= uVar16) {
              uVar16 = uVar13;
            }
            pbVar1 = (byte *)((long)pBlock + (ulong)(uVar12 >> 3));
            *pbVar1 = *pbVar1 | (byte)(uVar22 << (sbyte)(uVar12 & 7));
            uVar22 = uVar22 >> ((byte)uVar16 & 0x1f);
            uVar12 = uVar16 + uVar12;
          }
          if (0x80 < uVar12) goto LAB_00132fed;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
    }
    if (uVar12 == 0x80) {
      return;
    }
    __assert_fail("cur_bit_ofs == 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2da4,"void basist::encode_bc7_block(void *, const bc7_optimization_results *)")
    ;
  }
LAB_00132fce:
  __assert_fail("(num_bits <= 32) && (val < (1ULL << num_bits))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x2cf1,"void basist::bc7_set_block_bits(uint8_t *, uint32_t, uint32_t, uint32_t *)"
               );
}

Assistant:

void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
	{
		const uint32_t best_mode = pResults->m_mode;

		const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
		const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
		//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
		//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

		const uint8_t* pPartition;
		if (total_subsets == 1)
			pPartition = &g_bc7_partition1[0];
		else if (total_subsets == 2)
			pPartition = &g_bc7_partition2[pResults->m_partition * 16];
		else
			pPartition = &g_bc7_partition3[pResults->m_partition * 16];

		uint8_t color_selectors[16];
		memcpy(color_selectors, pResults->m_selectors, 16);

		uint8_t alpha_selectors[16];
		memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

		color_quad_u8 low[3], high[3];
		memcpy(low, pResults->m_low, sizeof(low));
		memcpy(high, pResults->m_high, sizeof(high));

		uint32_t pbits[3][2];
		memcpy(pbits, pResults->m_pbits, sizeof(pbits));

		int anchor[3] = { -1, -1, -1 };

		for (uint32_t k = 0; k < total_subsets; k++)
		{
			uint32_t anchor_index = 0;
			if (k)
			{
				if ((total_subsets == 3) && (k == 1))
					anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
				else if ((total_subsets == 3) && (k == 2))
					anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
				else
					anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
			}

			anchor[k] = anchor_index;

			const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_color_indices = 1 << color_index_bits;

			if (color_selectors[anchor_index] & (num_color_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

				if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
				{
					for (uint32_t q = 0; q < 3; q++)
					{
						uint8_t t = low[k].m_c[q];
						low[k].m_c[q] = high[k].m_c[q];
						high[k].m_c[q] = t;
					}
				}
				else
				{
					color_quad_u8 tmp = low[k];
					low[k] = high[k];
					high[k] = tmp;
				}

				if (!g_bc7_mode_has_shared_p_bits[best_mode])
				{
					uint32_t t = pbits[k][0];
					pbits[k][0] = pbits[k][1];
					pbits[k][1] = t;
				}
			}

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
				const uint32_t num_alpha_indices = 1 << alpha_index_bits;

				if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
				{
					for (uint32_t i = 0; i < 16; i++)
						if (pPartition[i] == k)
							alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

					uint8_t t = low[k].m_c[3];
					low[k].m_c[3] = high[k].m_c[3];
					high[k].m_c[3] = t;
				}
			}
		}

		uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
		memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

		uint32_t cur_bit_ofs = 0;
		bc7_set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

		if ((best_mode == 4) || (best_mode == 5))
			bc7_set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

		if (best_mode == 4)
			bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

		if (total_partitions > 1)
			bc7_set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

		const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
		for (uint32_t comp = 0; comp < total_comps; comp++)
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
				bc7_set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			}
		}

		if (g_bc7_mode_has_p_bits[best_mode])
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
				if (!g_bc7_mode_has_shared_p_bits[best_mode])
					bc7_set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
			}
		}

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					int idx = x + y * 4;

					uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

					if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
						n--;

					bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
				}
			}
		}

		assert(cur_bit_ofs == 128);
	}